

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infinite_suite.cpp
# Opt level: O1

void double_1_2_suite::test_input_half_output_half_half(void)

{
  undefined4 uVar1;
  undefined4 uVar2;
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  vector<double,_std::allocator<double>_> history;
  value_type local_d8;
  value_type local_d0;
  value_type local_c8 [1];
  infinite<double> filter;
  
  history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8[0] = 0.5;
  local_d8 = 0.5;
  local_d0 = 0.5;
  trial::online::impulse::infinite<double>::infinite<1ul,2ul>
            (&filter,&local_c8,(value_type (*) [2])&local_d8,1.0);
  trial::online::impulse::infinite<double>::push(&filter,1.0);
  if (filter.output.window.super_span<double,_18446744073709551615UL>.member.size == 0) {
    uVar1 = 0;
    uVar2 = 0;
  }
  else {
    if (filter.output.window.super_span<double,_18446744073709551615UL>.member.size == 0)
    goto LAB_00104090;
    uVar1 = SUB84(filter.output.window.super_span<double,_18446744073709551615UL>.member.data
                  [(filter.output.window.super_span<double,_18446744073709551615UL>.member.next -
                   filter.output.window.super_span<double,_18446744073709551615UL>.member.size) %
                   filter.output.window.super_span<double,_18446744073709551615UL>.member.cap],0);
    uVar2 = (undefined4)
            ((ulong)filter.output.window.super_span<double,_18446744073709551615UL>.member.data
                    [(filter.output.window.super_span<double,_18446744073709551615UL>.member.next -
                     filter.output.window.super_span<double,_18446744073709551615UL>.member.size) %
                     filter.output.window.super_span<double,_18446744073709551615UL>.member.cap] >>
            0x20);
  }
  local_d8 = (value_type)CONCAT44(uVar2,uVar1);
  if (history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&history,(iterator)
                        history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish,&local_d8);
  }
  else {
    *history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_finish = (double)CONCAT44(uVar2,uVar1);
    history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  if (filter.output.window.super_span<double,_18446744073709551615UL>.member.size == 0) {
    uVar1 = 0;
    uVar2 = 0;
  }
  else {
    if (filter.output.window.super_span<double,_18446744073709551615UL>.member.size == 0)
    goto LAB_00104090;
    uVar1 = SUB84(filter.output.window.super_span<double,_18446744073709551615UL>.member.data
                  [(filter.output.window.super_span<double,_18446744073709551615UL>.member.next -
                   filter.output.window.super_span<double,_18446744073709551615UL>.member.size) %
                   filter.output.window.super_span<double,_18446744073709551615UL>.member.cap],0);
    uVar2 = (undefined4)
            ((ulong)filter.output.window.super_span<double,_18446744073709551615UL>.member.data
                    [(filter.output.window.super_span<double,_18446744073709551615UL>.member.next -
                     filter.output.window.super_span<double,_18446744073709551615UL>.member.size) %
                     filter.output.window.super_span<double,_18446744073709551615UL>.member.cap] >>
            0x20);
  }
  local_d8 = (value_type)CONCAT44(uVar2,uVar1);
  local_c8[0] = 0.5;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1 * 0.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/impulse/infinite_suite.cpp"
             ,(char *)0x8a,0x107371,(char *)&local_d8,(double *)local_c8,
             history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,predicate);
  trial::online::impulse::infinite<double>::push(&filter,2.0);
  if (filter.output.window.super_span<double,_18446744073709551615UL>.member.size == 0) {
    uVar1 = 0;
    uVar2 = 0;
  }
  else {
    if (filter.output.window.super_span<double,_18446744073709551615UL>.member.size == 0)
    goto LAB_00104090;
    uVar1 = SUB84(filter.output.window.super_span<double,_18446744073709551615UL>.member.data
                  [(filter.output.window.super_span<double,_18446744073709551615UL>.member.next -
                   filter.output.window.super_span<double,_18446744073709551615UL>.member.size) %
                   filter.output.window.super_span<double,_18446744073709551615UL>.member.cap],0);
    uVar2 = (undefined4)
            ((ulong)filter.output.window.super_span<double,_18446744073709551615UL>.member.data
                    [(filter.output.window.super_span<double,_18446744073709551615UL>.member.next -
                     filter.output.window.super_span<double,_18446744073709551615UL>.member.size) %
                     filter.output.window.super_span<double,_18446744073709551615UL>.member.cap] >>
            0x20);
  }
  local_d8 = (value_type)CONCAT44(uVar2,uVar1);
  if (history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&history,(iterator)
                        history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish,&local_d8);
  }
  else {
    *history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_finish = (double)CONCAT44(uVar2,uVar1);
    history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  if (filter.output.window.super_span<double,_18446744073709551615UL>.member.size == 0) {
    uVar1 = 0;
    uVar2 = 0;
  }
  else {
    if (filter.output.window.super_span<double,_18446744073709551615UL>.member.size == 0)
    goto LAB_00104090;
    uVar1 = SUB84(filter.output.window.super_span<double,_18446744073709551615UL>.member.data
                  [(filter.output.window.super_span<double,_18446744073709551615UL>.member.next -
                   filter.output.window.super_span<double,_18446744073709551615UL>.member.size) %
                   filter.output.window.super_span<double,_18446744073709551615UL>.member.cap],0);
    uVar2 = (undefined4)
            ((ulong)filter.output.window.super_span<double,_18446744073709551615UL>.member.data
                    [(filter.output.window.super_span<double,_18446744073709551615UL>.member.next -
                     filter.output.window.super_span<double,_18446744073709551615UL>.member.size) %
                     filter.output.window.super_span<double,_18446744073709551615UL>.member.cap] >>
            0x20);
  }
  local_d8 = (value_type)CONCAT44(uVar2,uVar1);
  local_c8[0] = *history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start * -0.5 + 1.0;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","2 * 0.5 - history[0] * 0.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/impulse/infinite_suite.cpp"
             ,(char *)0x8d,0x107371,(char *)&local_d8,(double *)local_c8,
             history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,predicate_00);
  trial::online::impulse::infinite<double>::push(&filter,3.0);
  if (filter.output.window.super_span<double,_18446744073709551615UL>.member.size == 0) {
    uVar1 = 0;
    uVar2 = 0;
  }
  else {
    if (filter.output.window.super_span<double,_18446744073709551615UL>.member.size == 0)
    goto LAB_00104090;
    uVar1 = SUB84(filter.output.window.super_span<double,_18446744073709551615UL>.member.data
                  [(filter.output.window.super_span<double,_18446744073709551615UL>.member.next -
                   filter.output.window.super_span<double,_18446744073709551615UL>.member.size) %
                   filter.output.window.super_span<double,_18446744073709551615UL>.member.cap],0);
    uVar2 = (undefined4)
            ((ulong)filter.output.window.super_span<double,_18446744073709551615UL>.member.data
                    [(filter.output.window.super_span<double,_18446744073709551615UL>.member.next -
                     filter.output.window.super_span<double,_18446744073709551615UL>.member.size) %
                     filter.output.window.super_span<double,_18446744073709551615UL>.member.cap] >>
            0x20);
  }
  local_d8 = (value_type)CONCAT44(uVar2,uVar1);
  if (history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&history,(iterator)
                        history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish,&local_d8);
  }
  else {
    *history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_finish = (double)CONCAT44(uVar2,uVar1);
    history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  if (filter.output.window.super_span<double,_18446744073709551615UL>.member.size == 0) {
    uVar1 = 0;
    uVar2 = 0;
  }
  else {
    if (filter.output.window.super_span<double,_18446744073709551615UL>.member.size == 0)
    goto LAB_00104090;
    uVar1 = SUB84(filter.output.window.super_span<double,_18446744073709551615UL>.member.data
                  [(filter.output.window.super_span<double,_18446744073709551615UL>.member.next -
                   filter.output.window.super_span<double,_18446744073709551615UL>.member.size) %
                   filter.output.window.super_span<double,_18446744073709551615UL>.member.cap],0);
    uVar2 = (undefined4)
            ((ulong)filter.output.window.super_span<double,_18446744073709551615UL>.member.data
                    [(filter.output.window.super_span<double,_18446744073709551615UL>.member.next -
                     filter.output.window.super_span<double,_18446744073709551615UL>.member.size) %
                     filter.output.window.super_span<double,_18446744073709551615UL>.member.cap] >>
            0x20);
  }
  local_d8 = (value_type)CONCAT44(uVar2,uVar1);
  local_c8[0] = (1.5 - history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[1] * 0.5) -
                *history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start * 0.5;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","3 * 0.5 - history[1] * 0.5 - history[0] * 0.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/impulse/infinite_suite.cpp"
             ,(char *)0x90,0x107371,(char *)&local_d8,(double *)local_c8,
             history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,predicate_01);
  trial::online::impulse::infinite<double>::push(&filter,4.0);
  if (filter.output.window.super_span<double,_18446744073709551615UL>.member.size == 0) {
    uVar1 = 0;
    uVar2 = 0;
  }
  else {
    if (filter.output.window.super_span<double,_18446744073709551615UL>.member.size == 0)
    goto LAB_00104090;
    uVar1 = SUB84(filter.output.window.super_span<double,_18446744073709551615UL>.member.data
                  [(filter.output.window.super_span<double,_18446744073709551615UL>.member.next -
                   filter.output.window.super_span<double,_18446744073709551615UL>.member.size) %
                   filter.output.window.super_span<double,_18446744073709551615UL>.member.cap],0);
    uVar2 = (undefined4)
            ((ulong)filter.output.window.super_span<double,_18446744073709551615UL>.member.data
                    [(filter.output.window.super_span<double,_18446744073709551615UL>.member.next -
                     filter.output.window.super_span<double,_18446744073709551615UL>.member.size) %
                     filter.output.window.super_span<double,_18446744073709551615UL>.member.cap] >>
            0x20);
  }
  local_d8 = (value_type)CONCAT44(uVar2,uVar1);
  if (history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&history,(iterator)
                        history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish,&local_d8);
  }
  else {
    *history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_finish = (double)CONCAT44(uVar2,uVar1);
    history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  if (filter.output.window.super_span<double,_18446744073709551615UL>.member.size == 0) {
    uVar1 = 0;
    uVar2 = 0;
  }
  else {
    if (filter.output.window.super_span<double,_18446744073709551615UL>.member.size == 0) {
LAB_00104090:
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/external/trial.circular/include/trial/circular/detail/span.ipp"
                    ,0x79,
                    "const_reference trial::circular::span<double>::front() const [T = double, Extent = 18446744073709551615]"
                   );
    }
    uVar1 = SUB84(filter.output.window.super_span<double,_18446744073709551615UL>.member.data
                  [(filter.output.window.super_span<double,_18446744073709551615UL>.member.next -
                   filter.output.window.super_span<double,_18446744073709551615UL>.member.size) %
                   filter.output.window.super_span<double,_18446744073709551615UL>.member.cap],0);
    uVar2 = (undefined4)
            ((ulong)filter.output.window.super_span<double,_18446744073709551615UL>.member.data
                    [(filter.output.window.super_span<double,_18446744073709551615UL>.member.next -
                     filter.output.window.super_span<double,_18446744073709551615UL>.member.size) %
                     filter.output.window.super_span<double,_18446744073709551615UL>.member.cap] >>
            0x20);
  }
  local_d8 = (value_type)CONCAT44(uVar2,uVar1);
  local_c8[0] = (2.0 - history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[2] * 0.5) -
                history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[1] * 0.5;
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","4 * 0.5 - history[2] * 0.5 - history[1] * 0.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/impulse/infinite_suite.cpp"
             ,(char *)0x93,0x107371,(char *)&local_d8,(double *)local_c8,
             history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,predicate_02);
  if (filter.output.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(filter.output.coefficients.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)filter.output.coefficients.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)filter.output.coefficients.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (filter.output.window.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(filter.output.window.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)filter.output.window.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)filter.output.window.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (filter.input.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(filter.input.coefficients.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)filter.input.coefficients.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)filter.input.coefficients.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (filter.input.window.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(filter.input.window.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)filter.input.window.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)filter.input.window.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_input_half_output_quarter()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    std::vector<double> history;
    impulse::infinite<double> filter({0.5}, {0.25});
    filter.push(1);
    history.push_back(filter.value());
    TRIAL_TEST_WITH(filter.value(), 1 * 0.5, tolerance);
    filter.push(2);
    history.push_back(filter.value());
    TRIAL_TEST_WITH(filter.value(), 2 * 0.5 - history[0] * 0.25, tolerance);
    filter.push(3);
    history.push_back(filter.value());
    TRIAL_TEST_WITH(filter.value(), 3 * 0.5 - history[1] * 0.25, tolerance);
}